

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# PlanePart.cpp
# Opt level: O0

void __thiscall PlanePart::next(PlanePart *this,bool action)

{
  int iVar1;
  size_type sVar2;
  reference pvVar3;
  int local_3c;
  double dStack_38;
  int i;
  double probaChoice;
  vector<std::pair<double,_PlanePart>,_std::allocator<std::pair<double,_PlanePart>_>_>
  PlanePartWithProba;
  bool action_local;
  PlanePart *this_local;
  
  PlanePartWithProba.
  super__Vector_base<std::pair<double,_PlanePart>,_std::allocator<std::pair<double,_PlanePart>_>_>.
  _M_impl.super__Vector_impl_data._M_end_of_storage._7_1_ = action;
  nextPlanePartPossible
            ((vector<std::pair<double,_PlanePart>,_std::allocator<std::pair<double,_PlanePart>_>_> *
             )&probaChoice,this,action);
  iVar1 = rand();
  dStack_38 = (double)iVar1 / 2147483647.0;
  local_3c = 0;
  do {
    sVar2 = std::
            vector<std::pair<double,_PlanePart>,_std::allocator<std::pair<double,_PlanePart>_>_>::
            size((vector<std::pair<double,_PlanePart>,_std::allocator<std::pair<double,_PlanePart>_>_>
                  *)&probaChoice);
    if (sVar2 <= (ulong)(long)local_3c) {
LAB_00101ac4:
      std::vector<std::pair<double,_PlanePart>,_std::allocator<std::pair<double,_PlanePart>_>_>::
      ~vector((vector<std::pair<double,_PlanePart>,_std::allocator<std::pair<double,_PlanePart>_>_>
               *)&probaChoice);
      return;
    }
    pvVar3 = std::
             vector<std::pair<double,_PlanePart>,_std::allocator<std::pair<double,_PlanePart>_>_>::
             operator[]((vector<std::pair<double,_PlanePart>,_std::allocator<std::pair<double,_PlanePart>_>_>
                         *)&probaChoice,(long)local_3c);
    if (dStack_38 - pvVar3->first <= 0.0) {
      pvVar3 = std::
               vector<std::pair<double,_PlanePart>,_std::allocator<std::pair<double,_PlanePart>_>_>
               ::operator[]((vector<std::pair<double,_PlanePart>,_std::allocator<std::pair<double,_PlanePart>_>_>
                             *)&probaChoice,(long)local_3c);
      this->frequency = (pvVar3->second).frequency;
      pvVar3 = std::
               vector<std::pair<double,_PlanePart>,_std::allocator<std::pair<double,_PlanePart>_>_>
               ::operator[]((vector<std::pair<double,_PlanePart>,_std::allocator<std::pair<double,_PlanePart>_>_>
                             *)&probaChoice,(long)local_3c);
      this->whichPente = (bool)((pvVar3->second).whichPente & 1);
      goto LAB_00101ac4;
    }
    pvVar3 = std::
             vector<std::pair<double,_PlanePart>,_std::allocator<std::pair<double,_PlanePart>_>_>::
             operator[]((vector<std::pair<double,_PlanePart>,_std::allocator<std::pair<double,_PlanePart>_>_>
                         *)&probaChoice,(long)local_3c);
    dStack_38 = dStack_38 - pvVar3->first;
    local_3c = local_3c + 1;
  } while( true );
}

Assistant:

void PlanePart::next(bool action) {
    vector<pair<double,PlanePart>> PlanePartWithProba = nextPlanePartPossible(action);
    double probaChoice = (double) rand() / RAND_MAX;

    // On boucle sur toute les pièces du vecteur pour déterminer laquelle on choisit
    for (int i = 0; i < PlanePartWithProba.size(); i ++) {
        if (probaChoice - PlanePartWithProba[i].first > 0) {
            probaChoice -= PlanePartWithProba[i].first;
        }
        else {
            frequency = PlanePartWithProba[i].second.frequency;
            whichPente = PlanePartWithProba[i].second.whichPente;
            return;
        }
    }
}